

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtelnet.c
# Opt level: O2

void telnet_begin_sb(telnet_t *telnet,int telopt)

{
  size_t sStackY_20;
  char local_5 [5];
  
  if (telopt < 0x200) {
    local_5[0] = -1;
    local_5[1] = -6;
    if (telopt < 0x100) {
      local_5[2] = (char)telopt;
      sStackY_20 = 3;
    }
    else {
      local_5[2] = -1;
      local_5[3] = -6;
      sStackY_20 = 5;
      local_5[4] = (char)telopt;
    }
    _send(telnet,local_5,sStackY_20);
  }
  else {
    _error(telnet,0x5e4,"telnet_begin_sb",TELNET_EBADVAL,0,
           "supplied telopt %d for subnegotiation is greater than 511",telopt);
  }
  return;
}

Assistant:

void telnet_begin_sb(telnet_t *telnet, int telopt) {
	unsigned char sb[5];

	if (telopt > 511) {
		_error(telnet, __LINE__, __func__, TELNET_EBADVAL, 0,
				"supplied telopt %d for subnegotiation is greater than 511", telopt);
		return;
	}

	if (telopt > 255) {
		/* an EXOPL telopt */
		
		sb[0] = TELNET_IAC;
		sb[1] = TELNET_SB;
		sb[2] = TELNET_TELOPT_EXOPL;
		sb[3] = TELNET_SB;
		sb[4] = (unsigned char)(telopt - 256);

		_sendu(telnet, sb, 5);

		return;
	}
	
	sb[0] = TELNET_IAC;
	sb[1] = TELNET_SB;
	sb[2] = telopt;
	_sendu(telnet, sb, 3);
}